

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext *ctx,ImGuiID id)

{
  ImGuiDockNode *pIVar1;
  ImGuiID in_ESI;
  ImGuiDockNode *node;
  ImGuiContext *in_stack_ffffffffffffffc0;
  ImGuiID in_stack_ffffffffffffffdc;
  ImGuiDockNode *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    in_ESI = DockContextGenNodeID(in_stack_ffffffffffffffc0);
  }
  MemAlloc((size_t)in_stack_ffffffffffffffc0);
  pIVar1 = (ImGuiDockNode *)operator_new(0xb8);
  ImGuiDockNode::ImGuiDockNode(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ImGuiStorage::SetVoidPtr
            ((ImGuiStorage *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (ImGuiID)((ulong)pIVar1 >> 0x20),in_stack_ffffffffffffffe0);
  return pIVar1;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext->Nodes.SetVoidPtr(node->ID, node);
    return node;
}